

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseTracking::NameAndLocation::NameAndLocation
          (NameAndLocation *this,string *_name,SourceLineInfo *_location)

{
  pointer pcVar1;
  size_t sVar2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  sVar2 = _location->line;
  (this->location).file = _location->file;
  (this->location).line = sVar2;
  return;
}

Assistant:

NameAndLocation::NameAndLocation(std::string const &_name, SourceLineInfo const &_location)
        : name(_name)
        , location(_location) {
    }